

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool __thiscall duckdb::LikeMatcher::Match(LikeMatcher *this,string_t *str)

{
  vector<duckdb::LikeSegment,_true> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  ulong uVar3;
  int iVar4;
  reference pvVar5;
  idx_t iVar6;
  long lVar7;
  char *haystack;
  ulong haystack_size;
  bool bVar8;
  ulong uStack_40;
  
  haystack_size = (ulong)(str->value).pointer.length;
  if (haystack_size < 0xd) {
    haystack = (str->value).pointer.prefix;
  }
  else {
    haystack = (str->value).pointer.ptr;
  }
  this_00 = &this->segments;
  pLVar1 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->has_start_percentage == true) {
    uStack_40 = 0;
  }
  else {
    pvVar5 = vector<duckdb::LikeSegment,_true>::get<true>(this_00,0);
    uVar3 = (pvVar5->pattern)._M_string_length;
    bVar8 = haystack_size < uVar3;
    haystack_size = haystack_size - uVar3;
    if (bVar8) {
      return false;
    }
    iVar4 = bcmp(haystack,(pvVar5->pattern)._M_dataplus._M_p,uVar3);
    if (iVar4 != 0) {
      return false;
    }
    if ((long)(this->segments).
              super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
              super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->segments).
              super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
              super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
              super__Vector_impl_data._M_start == 0x20) {
      return (bool)(haystack_size == 0 | this->has_end_percentage);
    }
    haystack = haystack + uVar3;
    uStack_40 = 1;
  }
  for (; uStack_40 < ((long)pLVar1 - (long)pLVar2 >> 5) - 1U; uStack_40 = uStack_40 + 1) {
    pvVar5 = vector<duckdb::LikeSegment,_true>::get<true>(this_00,uStack_40);
    iVar6 = FindStrInStr((uchar *)haystack,haystack_size,(uchar *)(pvVar5->pattern)._M_dataplus._M_p
                         ,(pvVar5->pattern)._M_string_length);
    if (iVar6 == 0xffffffffffffffff) {
      return false;
    }
    lVar7 = iVar6 + (pvVar5->pattern)._M_string_length;
    haystack = haystack + lVar7;
    haystack_size = haystack_size - lVar7;
  }
  bVar8 = this->has_end_percentage;
  pvVar5 = vector<duckdb::LikeSegment,_true>::back(this_00);
  if (bVar8 == false) {
    uVar3 = (pvVar5->pattern)._M_string_length;
    if (haystack_size < uVar3) {
      return false;
    }
    iVar4 = bcmp(haystack + (haystack_size - uVar3),(pvVar5->pattern)._M_dataplus._M_p,uVar3);
    return iVar4 == 0;
  }
  iVar6 = FindStrInStr((uchar *)haystack,haystack_size,(uchar *)(pvVar5->pattern)._M_dataplus._M_p,
                       (pvVar5->pattern)._M_string_length);
  return iVar6 != 0xffffffffffffffff;
}

Assistant:

bool Match(string_t &str) {
		auto str_data = const_uchar_ptr_cast(str.GetData());
		auto str_len = str.GetSize();
		idx_t segment_idx = 0;
		idx_t end_idx = segments.size() - 1;
		if (!has_start_percentage) {
			// no start sample_size: match the first part of the string directly
			auto &segment = segments[0];
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data, segment.pattern.c_str(), segment.pattern.size()) != 0) {
				return false;
			}
			str_data += segment.pattern.size();
			str_len -= segment.pattern.size();
			segment_idx++;
			if (segments.size() == 1) {
				// only one segment, and it matches
				// we have a match if there is an end sample_size, OR if the memcmp was an exact match (remaining str is
				// empty)
				return has_end_percentage || str_len == 0;
			}
		}
		// main match loop: for every segment in the middle, use Contains to find the needle in the haystack
		for (; segment_idx < end_idx; segment_idx++) {
			auto &segment = segments[segment_idx];
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			if (next_offset == DConstants::INVALID_INDEX) {
				// could not find this pattern in the string: no match
				return false;
			}
			idx_t offset = next_offset + segment.pattern.size();
			str_data += offset;
			str_len -= offset;
		}
		if (!has_end_percentage) {
			end_idx--;
			// no end sample_size: match the final segment now
			auto &segment = segments.back();
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data + str_len - segment.pattern.size(), segment.pattern.c_str(), segment.pattern.size()) !=
			    0) {
				return false;
			}
			return true;
		} else {
			auto &segment = segments.back();
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			return next_offset != DConstants::INVALID_INDEX;
		}
	}